

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test<nrg::AsyncExecutor<nrg::TimedExecution>>(void)

{
  int local_7c;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_78;
  int local_6c;
  undefined1 local_68 [8];
  Function f;
  ExceptionHandler local_38;
  undefined1 local_18 [8];
  Executor<nrg::AsyncExecutor<nrg::TimedExecution>_> ex;
  
  std::function<void(std::exception_const&)>::function<void(&)(std::exception_const&),void>
            ((function<void(std::exception_const&)> *)&local_38,onError);
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>_>::Executor
            ((Executor<nrg::AsyncExecutor<nrg::TimedExecution>_> *)local_18,&local_38);
  std::function<void_(const_std::exception_&)>::~function(&local_38);
  std::function<void()>::function<void(&)(),void>((function<void()> *)local_68,noParam);
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::TimedExecution>> *)local_18,
             (function<void_()> *)local_68);
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::TimedExecution>> *)local_18,noParam);
  local_6c = 0x2a;
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::TimedExecution>> *)local_18,print2,&local_6c,
             (char (*) [6])"hallo");
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::TimedExecution>> *)local_18,exception);
  local_78 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_7c = 0x19;
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>>::operator()
            ((Executor<nrg::AsyncExecutor<nrg::TimedExecution>> *)local_18,print<int>,&local_78,
             &local_7c);
  std::function<void_()>::~function((function<void_()> *)local_68);
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>_>::~Executor
            ((Executor<nrg::AsyncExecutor<nrg::TimedExecution>_> *)local_18);
  return;
}

Assistant:

void test()
{
    nrg::Executor<ExecutionMode> ex(onError);
    typename ExecutionMode::Function f = noParam;
    ex(f);

    ex(noParam);
    ex(print2, 42, "hallo");
    ex(exception);

    ex(print<int>, std::ref(std::cerr), 25);
}